

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall
wabt::interp::DefinedFunc::DefinedFunc(DefinedFunc *this,Store *store,Ref instance,FuncDesc *desc)

{
  FuncType local_68;
  FuncDesc *local_28;
  FuncDesc *desc_local;
  Store *store_local;
  DefinedFunc *this_local;
  Ref instance_local;
  
  local_28 = desc;
  desc_local = (FuncDesc *)store;
  store_local = (Store *)this;
  this_local = (DefinedFunc *)instance.index;
  FuncType::FuncType(&local_68,&desc->type);
  Func::Func(&this->super_Func,DefinedFunc,&local_68);
  FuncType::~FuncType(&local_68);
  (this->super_Func).super_Extern.super_Object._vptr_Object =
       (_func_int **)&PTR__DefinedFunc_0049f8a0;
  (this->instance_).index = (size_t)this_local;
  FuncDesc::FuncDesc(&this->desc_,desc);
  return;
}

Assistant:

DefinedFunc::DefinedFunc(Store& store, Ref instance, FuncDesc desc)
    : Func(skind, desc.type), instance_(instance), desc_(desc) {}